

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loss_functions.cc
# Opt level: O0

float __thiscall
squaredloss::getUpdate
          (squaredloss *this,float prediction,float label,float update_scale,float pred_per_update)

{
  float in_XMM0_Da;
  double dVar1;
  float in_XMM1_Da;
  float in_XMM2_Da;
  float in_XMM3_Da;
  undefined4 local_4;
  
  if (1e-06 <= in_XMM2_Da * in_XMM3_Da) {
    dVar1 = std::exp((double)(ulong)(uint)(in_XMM2_Da * -2.0 * in_XMM3_Da));
    local_4 = ((in_XMM1_Da - in_XMM0_Da) * (1.0 - SUB84(dVar1,0))) / in_XMM3_Da;
  }
  else {
    local_4 = (in_XMM1_Da - in_XMM0_Da) * 2.0 * in_XMM2_Da;
  }
  return local_4;
}

Assistant:

float getUpdate(float prediction, float label, float update_scale, float pred_per_update)
  {
    if (update_scale * pred_per_update < 1e-6)
    {
      /* When exp(-eta_t)~= 1 we replace 1-exp(-eta_t)
       * with its first order Taylor expansion around 0
       * to avoid catastrophic cancellation.
       */
      return 2.f * (label - prediction) * update_scale;
    }
    return (label - prediction) * (1.f - correctedExp(-2.f * update_scale * pred_per_update)) / pred_per_update;
  }